

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gotcha.c
# Opt level: O0

gotcha_error_t gotcha_set_priority(char *tool_name,int value)

{
  FILE *__stream;
  undefined4 in_ESI;
  char *in_RDI;
  char *in_stack_00000028;
  tool_t *tool_to_place;
  gotcha_error_t error_on_set;
  char *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  char *local_40;
  uint in_stack_ffffffffffffffd0;
  gotcha_config_key_t in_stack_ffffffffffffffd4;
  char *in_stack_ffffffffffffffd8;
  tool_t *local_20;
  gotcha_error_t local_4;
  
  gotcha_init();
  __stream = _stderr;
  if (0 < debug_level) {
    in_stack_ffffffffffffffd0 = gotcha_gettid();
    in_stack_ffffffffffffffd4 = getpid();
    in_stack_ffffffffffffffd8 =
         strrchr("/workspace/llm4binary/github/license_all_cmakelists_1510/hbrunie[P]PyFloT/external-deps/GOTCHA/src/gotcha.c"
                 ,0x2f);
    local_40 = in_stack_ffffffffffffffd8;
    if (in_stack_ffffffffffffffd8 == (char *)0x0) {
      local_40 = "";
    }
    fprintf(__stream,"[%d/%d][%s:%u] - User called gotcha_set_priority(%s, %d)\n",
            (ulong)in_stack_ffffffffffffffd0,(ulong)in_stack_ffffffffffffffd4,local_40 + 1,0x16c);
    in_stack_ffffffffffffffa8 = in_RDI;
    in_stack_ffffffffffffffb0 = in_ESI;
  }
  local_4 = gotcha_configure_int
                      (in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0
                      );
  if (local_4 == GOTCHA_SUCCESS) {
    local_20 = get_tool(in_stack_ffffffffffffffa8);
    if (local_20 == (tool_t *)0x0) {
      local_20 = create_tool(in_stack_00000028);
    }
    remove_tool_from_list((tool_t *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
    reorder_tool(local_20);
    local_4 = GOTCHA_SUCCESS;
  }
  return local_4;
}

Assistant:

gotcha_error_t gotcha_set_priority(const char* tool_name, int value){
  gotcha_init();
  debug_printf(1, "User called gotcha_set_priority(%s, %d)\n", tool_name, value);
  enum gotcha_error_t error_on_set = gotcha_configure_int(tool_name, GOTCHA_PRIORITY, value);
  if(error_on_set != GOTCHA_SUCCESS) {
    return error_on_set;
  }
  tool_t* tool_to_place = get_tool(tool_name);
  if(!tool_to_place){
     tool_to_place = create_tool(tool_name);
  }
  remove_tool_from_list(tool_to_place);
  reorder_tool(tool_to_place);
  return GOTCHA_SUCCESS;
}